

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapArrayBufferInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  uint32 uVar1;
  int iVar2;
  uint uVar3;
  ScriptContext *pSVar4;
  SnapArrayBufferInfo *pSVar5;
  ArrayBuffer *pAVar6;
  undefined4 extraout_var;
  
  pSVar4 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar5 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapArrayBufferInfo*,(TTD::NSSnapObjects::SnapObjectType)23>
                     (snpObject);
  pAVar6 = Js::JavascriptLibrary::CreateArrayBuffer
                     ((pSVar4->super_ScriptContextBase).javascriptLibrary,pSVar5->Length);
  uVar1 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                    (pAVar6);
  if (uVar1 == pSVar5->Length) {
    iVar2 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(pAVar6);
    uVar3 = (*(pAVar6->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x71])(pAVar6);
    js_memcpy_s((void *)CONCAT44(extraout_var,iVar2),(ulong)uVar3,pSVar5->Buff,(ulong)pSVar5->Length
               );
    return (RecyclableObject *)pAVar6;
  }
  TTDAbort_unrecoverable_error("Something is wrong with our sizes.");
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapArrayBufferInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //ArrayBuffers can change on us so seems easiest to always re-create them.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapArrayBufferInfo* buffInfo = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(snpObject);

            Js::ArrayBuffer* abuff = ctx->GetLibrary()->CreateArrayBuffer(buffInfo->Length);
            TTDAssert(abuff->GetByteLength() == buffInfo->Length, "Something is wrong with our sizes.");

            js_memcpy_s(abuff->GetBuffer(), abuff->GetByteLength(), buffInfo->Buff, buffInfo->Length);

            return abuff;
        }